

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O1

void __thiscall PreciseMeasurement_unaryOps_Test::TestBody(PreciseMeasurement_unaryOps_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  precise_measurement x;
  precise_measurement y;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  precise_unit local_68;
  precise_unit local_58;
  long *local_48;
  precise_measurement local_40;
  precise_measurement local_28;
  
  local_40.value_ = 2.0;
  local_40.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_40.units_.base_units_ = (unit_data)0x1;
  local_40.units_.commodity_ = 0;
  local_48 = (long *)0x3f847ae147ae147b;
  local_28.value_ = 2.0;
  local_28.units_.multiplier_ = (double)0x3f847ae147ae147b;
  local_28.units_.base_units_ = (unit_data)0x1;
  local_28.units_.commodity_ = 0;
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            (local_78,"y","x",&local_28,&local_40);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1f1,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_68.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_68.multiplier_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.multiplier_ = -2.0;
  local_58.multiplier_ = -local_40.value_;
  testing::internal::CmpHelperEQ<double,double>
            (local_78,"z.value()","-x.value()",&local_68.multiplier_,&local_58.multiplier_);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1f2,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_68.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_68.multiplier_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.multiplier_ = (double)local_48;
  local_68.base_units_ = (unit_data)0x1;
  local_68.commodity_ = 0;
  local_58.multiplier_ = local_40.units_.multiplier_;
  local_58.base_units_ = local_40.units_.base_units_;
  local_58.commodity_ = local_40.units_.commodity_;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            (local_78,"z.units()","x.units()",&local_68,&local_58);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,499,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if ((long *)local_68.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_68.multiplier_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST(PreciseMeasurement, unaryOps)
{
    precise_measurement x(2.0, precise::cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.units(), x.units());
}